

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge,uchar *data)

{
  uchar uVar1;
  long lVar2;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_48;
  
  lVar2 = 0;
  do {
    uVar1 = data[lVar2];
    if (uVar1 != '\0') goto LAB_00169312;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  uVar1 = '\0';
LAB_00169312:
  if (uVar1 != '\0') {
    local_48.x.n[0] = *(uint64_t *)data;
    local_48.x.n[1] = *(uint64_t *)(data + 8);
    local_48.x.n[2] = *(uint64_t *)(data + 0x10);
    local_48.x.n[3] = *(uint64_t *)(data + 0x18);
    local_48.y.n[0] = *(uint64_t *)(data + 0x20);
    local_48.y.n[1] = *(uint64_t *)(data + 0x28);
    local_48.y.n[2] = *(uint64_t *)(data + 0x30);
    local_48.y.n[3] = *(uint64_t *)(data + 0x38);
    secp256k1_ge_from_storage(ge,&local_48);
    return;
  }
  ge->infinity = 1;
  (ge->x).n[0] = 0;
  (ge->x).n[1] = 0;
  (ge->x).n[2] = 0;
  (ge->x).n[3] = 0;
  (ge->x).n[4] = 0;
  (ge->y).n[0] = 0;
  (ge->y).n[1] = 0;
  (ge->y).n[2] = 0;
  (ge->y).n[3] = 0;
  (ge->y).n[4] = 0;
  return;
}

Assistant:

static void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge, const unsigned char *data) {
    static const unsigned char zeros[64] = { 0 };
    if (secp256k1_memcmp_var(data, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
    } else {
        secp256k1_ge_from_bytes(ge, data);
    }
}